

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O1

Am_Wrapper * Am_Get_Computed_Colors_Record_Form_proc(Am_Object *self)

{
  uint *puVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Ptr pvVar4;
  Computed_Colors_Record CVar5;
  Am_Object window;
  Am_Style foreground_color;
  Am_Value value;
  Am_Object local_30;
  Am_Style local_28;
  Am_Value local_20;
  Computed_Colors_Record local_10;
  
  Am_Style::Am_Style(&local_28);
  local_20.type = 0;
  local_20.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar3 = Am_Object::Get(self,0x6a,1);
  Am_Value::operator=(&local_20,pAVar3);
  if ((local_20.type & 0x7000) == 0x2000) {
    Am_Style::operator=(&local_28,&local_20);
  }
  local_30.data = (Am_Object_Data *)0x0;
  pAVar3 = Am_Object::Get(self,0x68,0);
  Am_Object::operator=(&local_30,pAVar3);
  bVar2 = Am_Object::Valid(&local_30);
  if (bVar2) {
    pAVar3 = Am_Object::Get(&local_30,0x7d2,0);
    pvVar4 = Am_Value::operator_cast_to_void_(pAVar3);
    CVar5 = black_and_white_rec;
    if ((pvVar4 != (Am_Ptr)0x0) && (*(int *)((long)pvVar4 + 0x54) == 1)) {
      if (black_and_white_rec.data != (Computed_Colors_Record_Data *)0x0) {
        puVar1 = &((black_and_white_rec.data)->super_Am_Wrapper).refs;
        *puVar1 = *puVar1 + 1;
      }
      goto LAB_0025e8fc;
    }
  }
  Computed_Colors_Record::Computed_Colors_Record(&local_10,&local_28);
  CVar5.data = local_10.data;
  if ((local_10.data != (Computed_Colors_Record_Data *)0x0) &&
     (((local_10.data)->super_Am_Wrapper).refs == 0)) {
    (*((local_10.data)->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])
              (local_10.data);
  }
LAB_0025e8fc:
  Am_Object::~Am_Object(&local_30);
  Am_Value::~Am_Value(&local_20);
  Am_Style::~Am_Style(&local_28);
  return &(CVar5.data)->super_Am_Wrapper;
}

Assistant:

Am_Define_Formula(Am_Wrapper *, Am_Get_Computed_Colors_Record_Form)
{
  Am_Style foreground_color;
  Am_Value value;
  bool is_color = true;
  value = self.Peek(Am_FILL_STYLE);
  if (Am_Type_Class(value.type) == Am_WRAPPER)
    foreground_color = value;
  Am_Object window;
  window = self.Get(Am_WINDOW);
  if (window.Valid()) {
    Am_Drawonable *draw = Am_Drawonable::Narrow(window.Get(Am_DRAWONABLE));
    is_color = !draw || draw->Is_Color();
  }
  if (is_color)
    return Computed_Colors_Record(foreground_color);
  else
    return black_and_white_rec;
}